

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.hpp
# Opt level: O3

JsonRpcException * __thiscall
jsonrpccxx::Dispatcher::process_type_error
          (JsonRpcException *__return_storage_ptr__,Dispatcher *this,string *name,
          JsonRpcException *e)

{
  value_t vVar1;
  int iVar2;
  pointer pcVar3;
  array_t *paVar4;
  bool bVar5;
  uint __val;
  char cVar6;
  char cVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  long *plVar10;
  long *plVar11;
  uint uVar12;
  uint ret;
  string message;
  uint ret_1;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  uint local_74;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar2 = e->code;
  if ((iVar2 == -0x7f5a) && (vVar1 = (e->data).m_type, vVar1 != null)) {
    if (vVar1 == array) {
      paVar4 = (e->data).m_value.array;
      if ((paVar4->
          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (paVar4->
          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00152ae5;
    }
    else if ((vVar1 != object) ||
            ((((e->data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0)) {
LAB_00152ae5:
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar3 = (e->message)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar3,pcVar3 + (e->message)._M_string_length);
      std::__cxx11::string::append((char *)&local_70);
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::find(&(this->mapping)._M_t,name);
      if ((_Rb_tree_header *)iVar8._M_node == &(this->mapping)._M_t._M_impl.super__Rb_tree_header) {
        local_50._M_dataplus._M_p._0_4_ = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
                  (&e->data,(uint *)&local_50);
        __val = (uint)local_50._M_dataplus._M_p;
        cVar7 = '\x01';
        if (9 < (uint)local_50._M_dataplus._M_p) {
          uVar12 = (uint)local_50._M_dataplus._M_p;
          cVar6 = '\x04';
          do {
            cVar7 = cVar6;
            if (uVar12 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_00152c7f;
            }
            if (uVar12 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_00152c7f;
            }
            if (uVar12 < 10000) goto LAB_00152c7f;
            bVar5 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar6 = cVar7 + '\x04';
          } while (bVar5);
          cVar7 = cVar7 + '\x01';
        }
LAB_00152c7f:
        local_98 = &local_88;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,(uint)local_90,__val);
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_98);
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
      }
      else {
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&this->mapping,name);
        local_74 = 0;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_int,_0>
                  (&e->data,&local_74);
        std::operator+(&local_50,"\"",
                       (pmVar9->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_74);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar11 = plVar10 + 2;
        if ((long *)*plVar10 == plVar11) {
          local_88 = *plVar11;
          lStack_80 = plVar10[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar11;
          local_98 = (long *)*plVar10;
        }
        local_90 = plVar10[1];
        *plVar10 = (long)plVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_98);
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p),
                          local_50.field_2._M_allocated_capacity + 1);
        }
      }
      JsonRpcException::JsonRpcException(__return_storage_ptr__,e->code,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
  }
  *(undefined ***)__return_storage_ptr__ = &PTR__JsonRpcException_0019f7f0;
  __return_storage_ptr__->code = iVar2;
  (__return_storage_ptr__->message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->message).field_2;
  pcVar3 = (e->message)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->message,pcVar3,
             pcVar3 + (e->message)._M_string_length);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&__return_storage_ptr__->data,&e->data);
  (__return_storage_ptr__->err)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->err).field_2;
  pcVar3 = (e->err)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->err,pcVar3,pcVar3 + (e->err)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

JsonRpcException process_type_error(const std::string &name, JsonRpcException &e) {
      if (e.Code() == -32602 && !e.Data().empty()) {
        std::string message = e.Message() + " for parameter ";
        if (this->mapping.find(name) != this->mapping.end()) {
          message += "\"" + mapping[name][e.Data().get<unsigned int>()] + "\"";
        } else {
          message += std::to_string(e.Data().get<unsigned int>());
        }
        return JsonRpcException(e.Code(), message);
      }
      return e;
    }